

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

SequenceExprSyntax * __thiscall
slang::parsing::Parser::parseDelayedSequenceExpr(Parser *this,SequenceExprSyntax *first)

{
  span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL> elements_00;
  Token openBracket_00;
  Token doubleHash;
  Token op_00;
  Token closeBracket_00;
  bool bVar1;
  bool bVar2;
  DelayedSequenceExprSyntax *pDVar3;
  EVP_PKEY_CTX *src;
  undefined8 *in_RDI;
  Token TVar4;
  Token TVar5;
  Parser *in_stack_00000020;
  bitmask<slang::parsing::detail::ExpressionOptions> in_stack_0000002c;
  SequenceExprSyntax *expr;
  Token hash;
  ExpressionSyntax *delayVal;
  SelectorSyntax *selector;
  Token closeBracket;
  Token openBracket;
  Token op;
  SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL> elements;
  undefined8 in_stack_fffffffffffffd78;
  Info *in_stack_fffffffffffffd80;
  Token *this_00;
  uint32_t offset;
  undefined1 auVar6 [12];
  undefined6 in_stack_fffffffffffffd88;
  TokenKind in_stack_fffffffffffffd8e;
  undefined8 in_stack_fffffffffffffd90;
  __extent_storage<18446744073709551615UL> _Var7;
  Info *in_stack_fffffffffffffd98;
  Token TVar8;
  ParserBase *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  Info *in_stack_fffffffffffffdb0;
  Parser *in_stack_fffffffffffffdc0;
  Info *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  DelayedSequenceElementSyntax *in_stack_fffffffffffffdd8;
  ExpressionSyntax *in_stack_fffffffffffffde8;
  Info *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  Parser *in_stack_fffffffffffffe78;
  bitmask<slang::parsing::detail::ExpressionOptions> local_fc;
  Token local_f8;
  Token local_e8;
  Token local_d8;
  Token local_c8;
  Token local_b8;
  ExpressionSyntax *local_a8;
  SelectorSyntax *local_a0;
  Token local_98;
  Token local_88;
  Token local_60;
  SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> local_50 [2];
  
  SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL> *)0x897284);
  TVar8.info = in_stack_fffffffffffffd98;
  TVar8.kind = (short)in_stack_fffffffffffffd90;
  TVar8._2_1_ = (char)((ulong)in_stack_fffffffffffffd90 >> 0x10);
  TVar8.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd90 >> 0x18);
  TVar8.rawLen = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  TVar4.info = in_stack_fffffffffffffd80;
  TVar4.kind = (short)in_stack_fffffffffffffd78;
  TVar4._2_1_ = (char)((ulong)in_stack_fffffffffffffd78 >> 0x10);
  TVar4.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd78 >> 0x18);
  TVar4.rawLen = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  TVar5.info = in_stack_fffffffffffffe08;
  TVar5.kind = (short)in_stack_fffffffffffffe10;
  TVar5._2_1_ = (char)((ulong)in_stack_fffffffffffffe10 >> 0x10);
  TVar5.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe10 >> 0x18);
  TVar5.rawLen = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  do {
    auVar6 = TVar4._12_12_;
    Token::Token((Token *)TVar4.info);
    this_00 = auVar6._4_8_;
    Token::Token(auVar6._0_8_);
    offset = (uint32_t)((ulong)this_00 >> 0x20);
    Token::Token(this_00);
    local_a0 = (SelectorSyntax *)0x0;
    local_a8 = (ExpressionSyntax *)0x0;
    TVar4 = ParserBase::expect(TVar5._0_8_,TVar5.info._6_2_);
    local_b8 = TVar4;
    bVar1 = ParserBase::peek(TVar8._0_8_,in_stack_fffffffffffffd8e);
    if (bVar1) {
      TVar4 = ParserBase::consume(in_stack_fffffffffffffda0);
      local_c8 = TVar4;
      local_88 = TVar4;
      bVar1 = ParserBase::peek(TVar8._0_8_,in_stack_fffffffffffffd8e);
      if (bVar1) {
LAB_008973e1:
        TVar4 = ParserBase::peek((ParserBase *)
                                 CONCAT26(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88),
                                 offset);
        local_d8.kind = TVar4.kind;
        bVar1 = local_d8.kind == CloseBracket;
        local_d8 = TVar4;
      }
      else {
        bVar2 = ParserBase::peek(TVar8._0_8_,in_stack_fffffffffffffd8e);
        bVar1 = false;
        if (bVar2) goto LAB_008973e1;
      }
      if (bVar1) {
        TVar5 = ParserBase::consume(in_stack_fffffffffffffda0);
        local_e8 = TVar5;
        local_60 = TVar5;
      }
      else {
        local_a0 = parseSequenceRange(in_stack_fffffffffffffdc0);
      }
      TVar4 = ParserBase::expect(TVar5._0_8_,TVar5.info._6_2_);
      local_98 = TVar4;
    }
    else {
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_fc,None);
      in_stack_fffffffffffffde8 = parsePrimaryExpression(in_stack_00000020,in_stack_0000002c);
      local_a8 = in_stack_fffffffffffffde8;
      TVar4 = local_f8;
    }
    local_f8 = TVar4;
    in_stack_fffffffffffffda0 = (ParserBase *)parseSequencePrimary(in_stack_fffffffffffffe78);
    in_stack_fffffffffffffd88 = SUB86(local_a0,0);
    in_stack_fffffffffffffd8e = (TokenKind)((ulong)local_a0 >> 0x30);
    doubleHash.info = in_stack_fffffffffffffdb0;
    doubleHash.kind = (short)in_stack_fffffffffffffda8;
    doubleHash._2_1_ = (char)((ulong)in_stack_fffffffffffffda8 >> 0x10);
    doubleHash.numFlags.raw = (char)((ulong)in_stack_fffffffffffffda8 >> 0x18);
    doubleHash.rawLen = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    openBracket_00.info = (Info *)in_stack_fffffffffffffda0;
    openBracket_00._0_8_ = local_98.info;
    op_00.info = in_stack_fffffffffffffdc8;
    op_00._0_8_ = in_stack_fffffffffffffdc0;
    closeBracket_00.info = (Info *)in_stack_fffffffffffffda0;
    closeBracket_00._0_8_ = in_stack_fffffffffffffdd8;
    TVar8 = local_98;
    TVar4 = local_60;
    in_stack_fffffffffffffdd8 =
         slang::syntax::SyntaxFactory::delayedSequenceElement
                   ((SyntaxFactory *)local_98._0_8_,doubleHash,(ExpressionSyntax *)local_a0,
                    openBracket_00,op_00,
                    (SelectorSyntax *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                    closeBracket_00,(SequenceExprSyntax *)in_stack_fffffffffffffde8);
    SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)TVar4.info,
               TVar4._0_8_);
    in_stack_fffffffffffffdd7 = ParserBase::peek(TVar8._0_8_,in_stack_fffffffffffffd8e);
    _Var7._M_extent_value = TVar8._0_8_;
    if (!(bool)in_stack_fffffffffffffdd7) {
      SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::copy
                (local_50,(EVP_PKEY_CTX *)*in_RDI,src);
      elements_00._M_ptr._6_2_ = in_stack_fffffffffffffd8e;
      elements_00._M_ptr._0_6_ = in_stack_fffffffffffffd88;
      elements_00._M_extent._M_extent_value = _Var7._M_extent_value;
      slang::syntax::SyntaxList<slang::syntax::DelayedSequenceElementSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::DelayedSequenceElementSyntax> *)TVar4.info,elements_00);
      pDVar3 = slang::syntax::SyntaxFactory::delayedSequenceExpr
                         ((SyntaxFactory *)TVar4.info,TVar4._0_8_,
                          (SyntaxList<slang::syntax::DelayedSequenceElementSyntax> *)0x89773f);
      SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL>::~SmallVector
                ((SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL> *)0x897753);
      return &pDVar3->super_SequenceExprSyntax;
    }
  } while( true );
}

Assistant:

SequenceExprSyntax& Parser::parseDelayedSequenceExpr(SequenceExprSyntax* first) {
    SmallVector<DelayedSequenceElementSyntax*> elements;
    do {
        Token op, openBracket, closeBracket;
        SelectorSyntax* selector = nullptr;
        ExpressionSyntax* delayVal = nullptr;

        auto hash = expect(TokenKind::DoubleHash);

        if (peek(TokenKind::OpenBracket)) {
            openBracket = consume();
            if ((peek(TokenKind::Star) || peek(TokenKind::Plus)) &&
                peek(1).kind == TokenKind::CloseBracket) {
                op = consume();
            }
            else {
                selector = parseSequenceRange();
            }
            closeBracket = expect(TokenKind::CloseBracket);
        }
        else {
            delayVal = &parsePrimaryExpression(ExpressionOptions::None);
        }

        auto& expr = parseSequencePrimary();
        elements.push_back(&factory.delayedSequenceElement(hash, delayVal, openBracket, op,
                                                           selector, closeBracket, expr));

    } while (peek(TokenKind::DoubleHash));

    return factory.delayedSequenceExpr(first, elements.copy(alloc));
}